

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitLocalPropInit
          (ByteCodeGenerator *this,RegSlot rhsLocation,Symbol *sym,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  PropertyId PVar4;
  uint scopeIndex;
  uint uVar5;
  RegSlot RVar6;
  Scope *this_00;
  undefined4 *puVar7;
  FuncInfo *this_01;
  FunctionBody *this_02;
  RegSlot local_94;
  OpCode op_1;
  RegSlot slotReg;
  PropertyId slot;
  RegSlot RStack_38;
  OpCode op;
  uint cacheId;
  RegSlot objReg;
  PropertyId propertyId;
  Scope *scope;
  FuncInfo *funcInfo_local;
  Symbol *sym_local;
  RegSlot rhsLocation_local;
  ByteCodeGenerator *this_local;
  
  this_00 = Symbol::GetScope(sym);
  bVar2 = Symbol::NeedsSlotAlloc(sym,this,funcInfo);
  if ((!bVar2) && (PVar4 = Symbol::GetScopeSlot(sym), PVar4 != -1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x118d,
                       "(sym->NeedsSlotAlloc(this, funcInfo) || sym->GetScopeSlot() == Js::Constants::NoProperty)"
                       ,
                       "sym->NeedsSlotAlloc(this, funcInfo) || sym->GetScopeSlot() == Js::Constants::NoProperty"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = Symbol::NeedsSlotAlloc(sym,this,funcInfo);
  if (bVar2) {
    bVar2 = Scope::GetIsObject(this_00);
    if (bVar2) {
      this_01 = TopFuncInfo(this);
      this_02 = FuncInfo::GetParsedFunctionBody(this_01);
      bVar2 = Js::ParseableFunctionInfo::DoStackNestedFunc(&this_02->super_ParseableFunctionInfo);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1195,
                           "(!this->TopFuncInfo()->GetParsedFunctionBody()->DoStackNestedFunc())",
                           "!this->TopFuncInfo()->GetParsedFunctionBody()->DoStackNestedFunc()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      PVar4 = Symbol::EnsurePosition(sym,this);
      bVar2 = Scope::HasInnerScopeIndex(this_00);
      if (bVar2) {
        RStack_38 = FuncInfo::InnerScopeToRegSlot(funcInfo,this_00);
      }
      else {
        RStack_38 = Scope::GetLocation(this_00);
      }
      uVar5 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RStack_38,PVar4,false,true);
      bVar2 = Symbol::GetIsNonSimpleParameter(sym);
      OVar3 = GetInitFldOp(this,this_00,RStack_38,funcInfo,bVar2);
      if ((RStack_38 == 0xffffffff) || (RStack_38 != funcInfo->frameObjRegister)) {
        bVar2 = Scope::HasInnerScopeIndex(this_00);
        if (bVar2) {
          scopeIndex = Scope::GetInnerScopeIndex(this_00);
          Js::ByteCodeWriter::ElementPIndexed(&this->m_writer,OVar3,rhsLocation,scopeIndex,uVar5);
        }
        else {
          RVar6 = Scope::GetLocation(this_00);
          Js::ByteCodeWriter::PatchableProperty
                    (&this->m_writer,OVar3,rhsLocation,RVar6,uVar5,false,true);
        }
      }
      else {
        Js::ByteCodeWriter::ElementP(&this->m_writer,OVar3,rhsLocation,uVar5,false,true);
      }
    }
    else {
      PVar4 = Symbol::EnsureScopeSlot(sym,this,funcInfo);
      bVar2 = Scope::GetCanMerge(this_00);
      if (bVar2) {
        local_94 = funcInfo->frameSlotsRegister;
      }
      else {
        local_94 = Scope::GetLocation(this_00);
      }
      OVar3 = GetStSlotOp(this,this_00,-1,local_94,false,funcInfo);
      if ((local_94 == 0xffffffff) || (local_94 != funcInfo->frameSlotsRegister)) {
        uVar5 = Scope::GetInnerScopeIndex(this_00);
        Js::ByteCodeWriter::SlotI2(&this->m_writer,OVar3,rhsLocation,uVar5,PVar4 + 2);
      }
      else {
        Js::ByteCodeWriter::SlotI1(&this->m_writer,OVar3,rhsLocation,PVar4 + 2);
      }
    }
  }
  RVar6 = Symbol::GetLocation(sym);
  if ((RVar6 != 0xffffffff) && (RVar6 = Symbol::GetLocation(sym), rhsLocation != RVar6)) {
    RVar6 = Symbol::GetLocation(sym);
    Js::ByteCodeWriter::Reg2(&this->m_writer,Ld_A,RVar6,rhsLocation);
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitLocalPropInit(Js::RegSlot rhsLocation, Symbol *sym, FuncInfo *funcInfo)
{
    Scope *scope = sym->GetScope();

    // Check consistency of sym->IsInSlot.
    Assert(sym->NeedsSlotAlloc(this, funcInfo) || sym->GetScopeSlot() == Js::Constants::NoProperty);

    // Arrived at the scope in which the property was defined.
    if (sym->NeedsSlotAlloc(this, funcInfo))
    {
        // The property is in memory rather than register. We'll have to load it from the slots.
        if (scope->GetIsObject())
        {
            Assert(!this->TopFuncInfo()->GetParsedFunctionBody()->DoStackNestedFunc());
            Js::PropertyId propertyId = sym->EnsurePosition(this);
            Js::RegSlot objReg;
            if (scope->HasInnerScopeIndex())
            {
                objReg = funcInfo->InnerScopeToRegSlot(scope);
            }
            else
            {
                objReg = scope->GetLocation();
            }
            uint cacheId = funcInfo->FindOrAddInlineCacheId(objReg, propertyId, false, true);
            Js::OpCode op = this->GetInitFldOp(scope, objReg, funcInfo, sym->GetIsNonSimpleParameter());
            if (objReg != Js::Constants::NoRegister && objReg == funcInfo->frameObjRegister)
            {
                this->m_writer.ElementP(op, rhsLocation, cacheId);
            }
            else if (scope->HasInnerScopeIndex())
            {
                this->m_writer.ElementPIndexed(op, rhsLocation, scope->GetInnerScopeIndex(), cacheId);
            }
            else
            {
                this->m_writer.PatchableProperty(op, rhsLocation, scope->GetLocation(), cacheId);
            }
        }
        else
        {
            // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
            Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
            Js::RegSlot slotReg = scope->GetCanMerge() ? funcInfo->frameSlotsRegister : scope->GetLocation();
            // Now store the property to its slot.
            Js::OpCode op = this->GetStSlotOp(scope, -1, slotReg, false, funcInfo);

            if (slotReg != Js::Constants::NoRegister && slotReg == funcInfo->frameSlotsRegister)
            {
                this->m_writer.SlotI1(op, rhsLocation, slot + Js::ScopeSlots::FirstSlotIndex);
            }
            else
            {
                this->m_writer.SlotI2(op, rhsLocation, scope->GetInnerScopeIndex(), slot + Js::ScopeSlots::FirstSlotIndex);
            }
        }
    }
    if (sym->GetLocation() != Js::Constants::NoRegister && rhsLocation != sym->GetLocation())
    {
        this->m_writer.Reg2(Js::OpCode::Ld_A, sym->GetLocation(), rhsLocation);
    }
}